

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remove_unused_columns.cpp
# Opt level: O3

void duckdb::MergeChildColumns
               (vector<duckdb::ColumnIndex,_true> *current_child_columns,
               ColumnIndex *new_child_column)

{
  pointer pCVar1;
  pointer pCVar2;
  vector<duckdb::ColumnIndex,_true> *pvVar3;
  pointer pCVar4;
  
  pCVar2 = (current_child_columns->
           super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>).
           super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
           super__Vector_impl_data._M_start;
  pCVar1 = (current_child_columns->
           super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>).
           super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
           super__Vector_impl_data._M_finish;
  while( true ) {
    if (pCVar2 == pCVar1) {
      return;
    }
    pvVar3 = &pCVar2->child_indexes;
    while (*(idx_t *)((long)(pvVar3 + -1) + 0x10) != new_child_column->index) {
      pCVar2 = (pointer)(pvVar3 + 1);
      pvVar3 = (vector<duckdb::ColumnIndex,_true> *)((long)(pvVar3 + 1) + 8);
      if (pCVar2 == pCVar1) {
        ::std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>::
        emplace_back<duckdb::ColumnIndex>
                  (&current_child_columns->
                    super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>,
                   new_child_column);
        return;
      }
    }
    if ((new_child_column->child_indexes).
        super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
        super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (new_child_column->child_indexes).
        super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
        super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
        super__Vector_impl_data._M_finish) break;
    new_child_column =
         vector<duckdb::ColumnIndex,_true>::operator[](&new_child_column->child_indexes,0);
    pCVar2 = (pvVar3->super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>).
             super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
             super__Vector_impl_data._M_start;
    pCVar1 = (pvVar3->super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>).
             super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
             super__Vector_impl_data._M_finish;
    current_child_columns = pvVar3;
  }
  pCVar2 = (pvVar3->super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>).
           super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
           super__Vector_impl_data._M_start;
  pCVar1 = (pvVar3->super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>).
           super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pCVar4 = pCVar2;
  if (pCVar1 == pCVar2) {
    return;
  }
  do {
    ::std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>::~vector
              (&(pCVar4->child_indexes).
                super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>);
    pCVar4 = pCVar4 + 1;
  } while (pCVar4 != pCVar1);
  (pvVar3->super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>).
  super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
  super__Vector_impl_data._M_finish = pCVar2;
  return;
}

Assistant:

void MergeChildColumns(vector<ColumnIndex> &current_child_columns, ColumnIndex &new_child_column) {
	if (current_child_columns.empty()) {
		// there's already a reference to the full column - we can't extract only a subfield
		// skip struct projection pushdown
		return;
	}
	// if we are already extract sub-fields, add it (if it is not there yet)
	for (auto &binding : current_child_columns) {
		if (binding.GetPrimaryIndex() != new_child_column.GetPrimaryIndex()) {
			continue;
		}
		// found a match: sub-field is already projected
		// check if we have child columns
		auto &nested_child_columns = binding.GetChildIndexesMutable();
		if (!new_child_column.HasChildren()) {
			// new child is a reference to a full column - clear any existing bindings (if any)
			nested_child_columns.clear();
		} else {
			// new child has a sub-reference - merge recursively
			D_ASSERT(new_child_column.ChildIndexCount() == 1);
			MergeChildColumns(nested_child_columns, new_child_column.GetChildIndex(0));
		}
		return;
	}
	// this child column is not projected yet - add it in
	current_child_columns.push_back(std::move(new_child_column));
}